

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O1

void dCopy_CompCol_Matrix(SuperMatrix *A,SuperMatrix *B)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  B->Stype = A->Stype;
  B->Dtype = A->Dtype;
  B->Mtype = A->Mtype;
  B->nrow = A->nrow;
  uVar1 = A->ncol;
  B->ncol = uVar1;
  piVar3 = (int *)A->Store;
  piVar4 = (int *)B->Store;
  iVar2 = *piVar3;
  lVar6 = (long)iVar2;
  *piVar4 = iVar2;
  if (0 < lVar6) {
    lVar5 = *(long *)(piVar3 + 2);
    lVar7 = *(long *)(piVar4 + 2);
    lVar8 = 0;
    do {
      *(undefined8 *)(lVar7 + lVar8 * 8) = *(undefined8 *)(lVar5 + lVar8 * 8);
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  if (0 < iVar2) {
    lVar5 = *(long *)(piVar3 + 4);
    lVar7 = *(long *)(piVar4 + 4);
    lVar8 = 0;
    do {
      *(undefined4 *)(lVar7 + lVar8 * 4) = *(undefined4 *)(lVar5 + lVar8 * 4);
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  if (-1 < (int)uVar1) {
    lVar6 = *(long *)(piVar3 + 6);
    lVar5 = *(long *)(piVar4 + 6);
    lVar7 = 0;
    do {
      *(undefined4 *)(lVar5 + lVar7 * 4) = *(undefined4 *)(lVar6 + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar1 + 1 != lVar7);
  }
  return;
}

Assistant:

void
dCopy_CompCol_Matrix(SuperMatrix *A, SuperMatrix *B)
{
    NCformat *Astore, *Bstore;
    int      ncol, nnz, i;

    B->Stype = A->Stype;
    B->Dtype = A->Dtype;
    B->Mtype = A->Mtype;
    B->nrow  = A->nrow;;
    B->ncol  = ncol = A->ncol;
    Astore   = (NCformat *) A->Store;
    Bstore   = (NCformat *) B->Store;
    Bstore->nnz = nnz = Astore->nnz;
    for (i = 0; i < nnz; ++i)
	((double *)Bstore->nzval)[i] = ((double *)Astore->nzval)[i];
    for (i = 0; i < nnz; ++i) Bstore->rowind[i] = Astore->rowind[i];
    for (i = 0; i <= ncol; ++i) Bstore->colptr[i] = Astore->colptr[i];
}